

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandIProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  long lVar1;
  int *piVar2;
  Abc_Ntk_t *pNtk;
  int iVar3;
  int iVar4;
  uint iPo;
  abctime aVar5;
  int *__ptr;
  long lVar6;
  abctime aVar7;
  abctime time;
  char *pcVar8;
  char *pcVar9;
  int i;
  Abc_Ntk_t *local_a0;
  Abc_Ntk_t *local_98;
  Prove_Params_t Params;
  Abc_Cex_t *pCex;
  
  local_98 = Abc_FrameReadNtk(pAbc);
  Prove_ParamsSetDefault(&Params);
  Params.fUseRewriting = 1;
  Params.fVerbose = 0;
  Extra_UtilGetoptReset();
LAB_0020bdcf:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"NCFGLIrfbvh");
    pNtk = local_98;
    iVar4 = globalUtilOptind;
    switch(iVar3) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0020bf65:
        Abc_Print(-1,pcVar8);
        goto switchD_0020bdeb_caseD_44;
      }
      Params.nMiteringLimitStart = atoi(argv[globalUtilOptind]);
      iVar3 = Params.nMiteringLimitStart;
      break;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
      goto switchD_0020bdeb_caseD_44;
    case 0x46:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0020bf65;
      }
      Params.nFraigingLimitStart = atoi(argv[globalUtilOptind]);
      iVar3 = Params.nFraigingLimitStart;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-G\" should be followed by an integer.\n";
        goto LAB_0020bf65;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      Params.nFraigingLimitMulti = (float)iVar3;
      break;
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0020bf65;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      Params.nTotalInspectLimit = (ABC_INT64_T)iVar3;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_0020bf65;
      }
      Params.nMiteringLimitLast = atoi(argv[globalUtilOptind]);
      iVar3 = Params.nMiteringLimitLast;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0020bf65;
      }
      Params.nItersMax = atoi(argv[globalUtilOptind]);
      iVar3 = Params.nItersMax;
      break;
    default:
      if (iVar3 == 0x62) {
        Params.fUseBdds = Params.fUseBdds ^ 1;
      }
      else if (iVar3 == 0x66) {
        Params.fUseFraiging = Params.fUseFraiging ^ 1;
      }
      else if (iVar3 == 0x72) {
        Params.fUseRewriting = Params.fUseRewriting ^ 1;
      }
      else {
        if (iVar3 != 0x76) {
          if (iVar3 == -1) {
            if (local_98 == (Abc_Ntk_t *)0x0) {
              pcVar8 = "Empty network.\n";
            }
            else {
              if (local_98->nObjCounts[8] < 1) {
                aVar5 = Abc_Clock();
                if (pNtk->ntkType == ABC_NTK_STRASH) {
                  local_a0 = Abc_NtkDup(pNtk);
                }
                else {
                  local_a0 = Abc_NtkStrash(pNtk,0,0,0);
                }
                iVar4 = Abc_NtkIvyProve(&local_a0,&Params);
                if (iVar4 == 0) {
                  __ptr = Abc_NtkVerifySimulatePattern(pNtk,local_a0->pModel);
                  iPo = 0xffffffff;
                  lVar6 = 0;
                  goto LAB_0020c13a;
                }
                pAbc->Status = iVar4;
                if (iVar4 == -1) {
                  pcVar8 = "UNDECIDED      ";
                }
                else {
                  pcVar8 = "UNSATISFIABLE  ";
                }
                Abc_Print(1,pcVar8);
                iPo = 0xffffffff;
                goto LAB_0020c1c1;
              }
              pcVar8 = "The network has registers. Use \"dprove\".\n";
            }
            iVar4 = -1;
            goto LAB_0020c093;
          }
          goto switchD_0020bdeb_caseD_44;
        }
        Params.fVerbose = Params.fVerbose ^ 1;
      }
      goto LAB_0020bdcf;
    }
    globalUtilOptind = iVar4 + 1;
    if (iVar3 < 0) {
switchD_0020bdeb_caseD_44:
      iVar4 = -2;
      Abc_Print(-2,"usage: iprove [-NCFGLI num] [-rfbvh]\n");
      Abc_Print(-2,"\t         performs CEC using a new method\n");
      Abc_Print(-2,"\t-N num : max number of iterations [default = %d]\n",
                (ulong)(uint)Params.nItersMax);
      Abc_Print(-2,"\t-C num : max starting number of conflicts in mitering [default = %d]\n",
                (ulong)(uint)Params.nMiteringLimitStart);
      Abc_Print(-2,"\t-F num : max starting number of conflicts in fraiging [default = %d]\n",
                (ulong)(uint)Params.nFraigingLimitStart);
      Abc_Print(-2,"\t-G num : multiplicative coefficient for fraiging [default = %d]\n",
                (ulong)(uint)(int)Params.nFraigingLimitMulti);
      Abc_Print(-2,"\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n",
                (ulong)(uint)Params.nMiteringLimitLast);
      Abc_Print(-2,"\t-I num : max number of clause inspections in all SAT calls [default = %d]\n",
                Params.nTotalInspectLimit & 0xffffffff);
      pcVar9 = "yes";
      pcVar8 = "yes";
      if (Params.fUseRewriting == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (Params.fUseFraiging == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle the use of FRAIGing [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (Params.fUseBdds == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle the use of BDDs [default = %s]\n",pcVar8);
      if (Params.fVerbose == 0) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar9);
      pcVar8 = "\t-h     : print the command usage\n";
LAB_0020c093:
      Abc_Print(iVar4,pcVar8);
      return 1;
    }
  } while( true );
  while( true ) {
    Abc_NtkCo(pNtk,i);
    lVar1 = lVar6 + 1;
    piVar2 = __ptr + lVar6;
    lVar6 = lVar1;
    if (*piVar2 == 1) break;
LAB_0020c13a:
    iVar3 = pNtk->vCos->nSize;
    i = (int)lVar6;
    if (iVar3 <= lVar6) goto LAB_0020c16d;
  }
  iVar3 = pNtk->vCos->nSize;
  iPo = (int)lVar1 - 1;
LAB_0020c16d:
  if (iVar3 == i) {
    Abc_Print(1,"ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n");
  }
  free(__ptr);
  pAbc->Status = 0;
  pcVar8 = "SATISFIABLE (output = %d) ";
  Abc_Print(1,"SATISFIABLE (output = %d) ",(ulong)iPo);
LAB_0020c1c1:
  aVar7 = Abc_Clock();
  Abc_PrintTime((int)aVar7 - (int)aVar5,pcVar8,time);
  Abc_FrameReplaceCurrentNetwork(pAbc,local_a0);
  if ((iVar4 == 0) && (local_a0->nObjCounts[8] == 0)) {
    pCex = Abc_CexDeriveFromCombModel(local_a0->pModel,local_a0->vPis->nSize,0,iPo);
    Abc_FrameReplaceCex(pAbc,&pCex);
  }
  return 0;
}

Assistant:

int Abc_CommandIProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pNtk, * pNtkTemp;
    int c, RetValue, iOut = -1;
    abctime clk;

    extern int Abc_NtkIvyProve( Abc_Ntk_t ** ppNtk, void * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Prove_ParamsSetDefault( pParams );
    pParams->fUseRewriting = 1;
    pParams->fVerbose      = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCFGLIrfbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nItersMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitMulti = (float)atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitMulti < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitLast = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitLast < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nTotalInspectLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nTotalInspectLimit < 0 )
                goto usage;
            break;
        case 'r':
            pParams->fUseRewriting ^= 1;
            break;
        case 'f':
            pParams->fUseFraiging ^= 1;
            break;
        case 'b':
            pParams->fUseBdds ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "The network has registers. Use \"dprove\".\n" );
        return 1;
    }

    clk = Abc_Clock();

    if ( Abc_NtkIsStrash(pNtk) )
        pNtkTemp = Abc_NtkDup( pNtk );
    else
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );

    RetValue = Abc_NtkIvyProve( &pNtkTemp, pParams );

    // verify that the pattern is correct
    if ( RetValue == 0 )
    {
        Abc_Obj_t * pObj;
        int i;
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtkTemp->pModel );
        Abc_NtkForEachCo( pNtk, pObj, i )
            if ( pSimInfo[i] == 1 )
            {
                iOut = i;
                break;
            }
        if ( i == Abc_NtkCoNum(pNtk) )
            Abc_Print( 1, "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
        ABC_FREE( pSimInfo );
    }
    pAbc->Status = RetValue;
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE (output = %d) ", iOut );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkTemp );
    // update counter example
    if ( RetValue == 0 && Abc_NtkLatchNum(pNtkTemp) == 0 )
    {
        Abc_Cex_t * pCex = Abc_CexDeriveFromCombModel( pNtkTemp->pModel, Abc_NtkPiNum(pNtkTemp), 0, iOut );
        Abc_FrameReplaceCex( pAbc, &pCex );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: iprove [-NCFGLI num] [-rfbvh]\n" );
    Abc_Print( -2, "\t         performs CEC using a new method\n" );
    Abc_Print( -2, "\t-N num : max number of iterations [default = %d]\n", pParams->nItersMax );
    Abc_Print( -2, "\t-C num : max starting number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitStart );
    Abc_Print( -2, "\t-F num : max starting number of conflicts in fraiging [default = %d]\n", pParams->nFraigingLimitStart );
    Abc_Print( -2, "\t-G num : multiplicative coefficient for fraiging [default = %d]\n", (int)pParams->nFraigingLimitMulti );
    Abc_Print( -2, "\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitLast );
    Abc_Print( -2, "\t-I num : max number of clause inspections in all SAT calls [default = %d]\n", (int)pParams->nTotalInspectLimit );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", pParams->fUseRewriting? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle the use of FRAIGing [default = %s]\n", pParams->fUseFraiging? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle the use of BDDs [default = %s]\n", pParams->fUseBdds? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}